

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Status __thiscall
leveldb::DBImpl::RecoverLogFile
          (DBImpl *this,uint64_t log_number,bool last_log,bool *save_manifest,VersionEdit *edit,
          SequenceNumber *max_sequence)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  SequenceNumber SVar5;
  ulong uVar6;
  size_t sVar7;
  Writer *this_00;
  MemTable *this_01;
  _func_int **pp_Var8;
  undefined7 in_register_00000011;
  uint64_t number;
  long in_FS_OFFSET;
  ulong *in_stack_00000008;
  VersionEdit *local_190;
  int local_180;
  Slice local_158;
  uint64_t lfile_size;
  Env *local_140;
  Comparator local_138;
  Slice record;
  LogReporter reporter;
  SequentialFile *file;
  Reader reader;
  WriteBatch batch;
  string scratch;
  string fname;
  
  number = CONCAT71(in_register_00000011,last_log);
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  LogFileName(&fname,(string *)(log_number + 0x98),number);
  (**(code **)(**(long **)(log_number + 8) + 0x10))(this,*(long **)(log_number + 8),&fname,&file);
  if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
    reporter.super_Reporter._vptr_Reporter = (_func_int **)&PTR__Reporter_01148478;
    reporter.env = *(Env **)(log_number + 8);
    reporter.info_log = *(Logger **)(log_number + 0x48);
    reporter.fname = fname._M_dataplus._M_p;
    reporter.status = (Status *)(DBImpl *)0x0;
    if (*(char *)(log_number + 0x3a) != '\0') {
      reporter.status = (Status *)this;
    }
    log::Reader::Reader(&reader,file,&reporter.super_Reporter,true,0);
    Log(*(Logger **)(log_number + 0x48),"Recovering log #%llu",number);
    scratch._M_dataplus._M_p = (pointer)&scratch.field_2;
    scratch._M_string_length = 0;
    scratch.field_2._M_local_buf[0] = '\0';
    record.data_ = "";
    record.size_ = 0;
    WriteBatch::WriteBatch(&batch);
    local_180 = 0;
    do {
      local_190 = (VersionEdit *)0x0;
      do {
        while( true ) {
          bVar3 = log::Reader::ReadRecord(&reader,&record,&scratch);
          sVar7 = record.size_;
          pp_Var8 = (this->super_DB)._vptr_DB;
          if (!bVar3 || pp_Var8 != (_func_int **)0x0) goto LAB_00a2d5e3;
          if (0xb < record.size_) break;
          lfile_size = (uint64_t)anon_var_dwarf_3915d0c;
          local_140 = (Env *)0x14;
          local_158.data_ = fname._M_dataplus._M_p;
          local_158.size_ = fname._M_string_length;
          Status::Corruption((Status *)&local_138,(Slice *)&lfile_size,&local_158);
          RecoverLogFile(unsigned_long,bool,bool*,leveldb::VersionEdit*,unsigned_long*)::LogReporter
          ::Corruption(unsigned_long,leveldb::Status_const__(&reporter,sVar7,(Status *)&local_138);
          Status::~Status((Status *)&local_138);
        }
        WriteBatchInternal::SetContents(&batch,&record);
        if (local_190 == (VersionEdit *)0x0) {
          local_190 = (VersionEdit *)operator_new(0x70);
          MemTable::MemTable((MemTable *)local_190,(InternalKeyComparator *)(log_number + 0x10));
          paVar1 = &(local_190->comparator_).field_2;
          *(int *)paVar1 = *(int *)paVar1 + 1;
        }
        WriteBatchInternal::InsertInto((WriteBatch *)&lfile_size,(MemTable *)&batch);
        pp_Var8 = (this->super_DB)._vptr_DB;
        (this->super_DB)._vptr_DB = (_func_int **)lfile_size;
        lfile_size = (uint64_t)pp_Var8;
        Status::~Status((Status *)&lfile_size);
        MaybeIgnoreError((DBImpl *)log_number,(Status *)this);
        pp_Var8 = (this->super_DB)._vptr_DB;
        if (pp_Var8 != (_func_int **)0x0) goto LAB_00a2d5e3;
        SVar5 = WriteBatchInternal::Sequence(&batch);
        iVar4 = WriteBatchInternal::Count(&batch);
        uVar6 = ((long)iVar4 + SVar5) - 1;
        if (*in_stack_00000008 < uVar6) {
          *in_stack_00000008 = uVar6;
        }
        sVar7 = MemTable::ApproximateMemoryUsage((MemTable *)local_190);
      } while (sVar7 <= *(ulong *)(log_number + 0x50));
      *(undefined1 *)&(edit->comparator_)._M_dataplus._M_p = 1;
      WriteLevel0Table((DBImpl *)&lfile_size,(MemTable *)log_number,local_190,
                       (Version *)max_sequence);
      local_180 = local_180 + 1;
      pp_Var8 = (this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = (_func_int **)lfile_size;
      lfile_size = (uint64_t)pp_Var8;
      Status::~Status((Status *)&lfile_size);
      MemTable::Unref((MemTable *)local_190);
      pp_Var8 = (this->super_DB)._vptr_DB;
    } while (pp_Var8 == (_func_int **)0x0);
    local_190 = (VersionEdit *)0x0;
LAB_00a2d5e3:
    if (file != (SequentialFile *)0x0) {
      (*file->_vptr_SequentialFile[1])();
      pp_Var8 = (this->super_DB)._vptr_DB;
    }
    if ((pp_Var8 == (_func_int **)0x0) &&
       (((byte)save_manifest & *(byte *)(log_number + 0x84) & local_180 == 0) == 1)) {
      if (*(long *)(log_number + 0x148) != 0) {
        __assert_fail("logfile_ == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                      ,0x1d5,
                      "Status leveldb::DBImpl::RecoverLogFile(uint64_t, bool, bool *, VersionEdit *, SequenceNumber *)"
                     );
      }
      if (*(long *)(log_number + 0x158) != 0) {
        __assert_fail("log_ == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                      ,0x1d6,
                      "Status leveldb::DBImpl::RecoverLogFile(uint64_t, bool, bool *, VersionEdit *, SequenceNumber *)"
                     );
      }
      if (*(long *)(log_number + 0x130) != 0) {
        __assert_fail("mem_ == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                      ,0x1d7,
                      "Status leveldb::DBImpl::RecoverLogFile(uint64_t, bool, bool *, VersionEdit *, SequenceNumber *)"
                     );
      }
      (**(code **)(**(long **)(log_number + 8) + 0x58))
                (&local_158,*(long **)(log_number + 8),&fname,&lfile_size);
      if (local_158.data_ == (pointer)0x0) {
        (**(code **)(**(long **)(log_number + 8) + 0x28))
                  (&local_138,*(long **)(log_number + 8),&fname,(undefined8 *)(log_number + 0x148));
        Status::~Status((Status *)&local_138);
        Status::~Status((Status *)&local_158);
        if (local_138._vptr_Comparator == (_func_int **)0x0) {
          Log(*(Logger **)(log_number + 0x48),"Reusing old log %s \n",fname._M_dataplus._M_p);
          this_00 = (Writer *)operator_new(0x20);
          log::Writer::Writer(this_00,*(WritableFile **)(log_number + 0x148),lfile_size);
          *(Writer **)(log_number + 0x158) = this_00;
          *(uint64_t *)(log_number + 0x150) = number;
          if (local_190 == (VersionEdit *)0x0) {
            this_01 = (MemTable *)operator_new(0x70);
            MemTable::MemTable(this_01,(InternalKeyComparator *)(log_number + 0x10));
            *(MemTable **)(log_number + 0x130) = this_01;
            this_01->refs_ = this_01->refs_ + 1;
          }
          else {
            *(VersionEdit **)(log_number + 0x130) = local_190;
          }
          local_190 = (VersionEdit *)0x0;
        }
      }
      else {
        Status::~Status((Status *)&local_158);
      }
    }
    if (local_190 != (VersionEdit *)0x0) {
      if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
        *(undefined1 *)&(edit->comparator_)._M_dataplus._M_p = 1;
        WriteLevel0Table((DBImpl *)&lfile_size,(MemTable *)log_number,local_190,
                         (Version *)max_sequence);
        pp_Var8 = (this->super_DB)._vptr_DB;
        (this->super_DB)._vptr_DB = (_func_int **)lfile_size;
        lfile_size = (uint64_t)pp_Var8;
        Status::~Status((Status *)&lfile_size);
      }
      MemTable::Unref((MemTable *)local_190);
    }
    WriteBatch::~WriteBatch(&batch);
    std::__cxx11::string::~string((string *)&scratch);
    log::Reader::~Reader(&reader);
    log::Reader::Reporter::~Reporter(&reporter.super_Reporter);
  }
  else {
    MaybeIgnoreError((DBImpl *)log_number,(Status *)this);
  }
  std::__cxx11::string::~string((string *)&fname);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status DBImpl::RecoverLogFile(uint64_t log_number, bool last_log,
                              bool* save_manifest, VersionEdit* edit,
                              SequenceNumber* max_sequence) {
  struct LogReporter : public log::Reader::Reporter {
    Env* env;
    Logger* info_log;
    const char* fname;
    Status* status;  // null if options_.paranoid_checks==false
    void Corruption(size_t bytes, const Status& s) override {
      Log(info_log, "%s%s: dropping %d bytes; %s",
          (this->status == nullptr ? "(ignoring error) " : ""), fname,
          static_cast<int>(bytes), s.ToString().c_str());
      if (this->status != nullptr && this->status->ok()) *this->status = s;
    }
  };

  mutex_.AssertHeld();

  // Open the log file
  std::string fname = LogFileName(dbname_, log_number);
  SequentialFile* file;
  Status status = env_->NewSequentialFile(fname, &file);
  if (!status.ok()) {
    MaybeIgnoreError(&status);
    return status;
  }

  // Create the log reader.
  LogReporter reporter;
  reporter.env = env_;
  reporter.info_log = options_.info_log;
  reporter.fname = fname.c_str();
  reporter.status = (options_.paranoid_checks ? &status : nullptr);
  // We intentionally make log::Reader do checksumming even if
  // paranoid_checks==false so that corruptions cause entire commits
  // to be skipped instead of propagating bad information (like overly
  // large sequence numbers).
  log::Reader reader(file, &reporter, true /*checksum*/, 0 /*initial_offset*/);
  Log(options_.info_log, "Recovering log #%llu",
      (unsigned long long)log_number);

  // Read all the records and add to a memtable
  std::string scratch;
  Slice record;
  WriteBatch batch;
  int compactions = 0;
  MemTable* mem = nullptr;
  while (reader.ReadRecord(&record, &scratch) && status.ok()) {
    if (record.size() < 12) {
      reporter.Corruption(record.size(),
                          Status::Corruption("log record too small", fname));
      continue;
    }
    WriteBatchInternal::SetContents(&batch, record);

    if (mem == nullptr) {
      mem = new MemTable(internal_comparator_);
      mem->Ref();
    }
    status = WriteBatchInternal::InsertInto(&batch, mem);
    MaybeIgnoreError(&status);
    if (!status.ok()) {
      break;
    }
    const SequenceNumber last_seq = WriteBatchInternal::Sequence(&batch) +
                                    WriteBatchInternal::Count(&batch) - 1;
    if (last_seq > *max_sequence) {
      *max_sequence = last_seq;
    }

    if (mem->ApproximateMemoryUsage() > options_.write_buffer_size) {
      compactions++;
      *save_manifest = true;
      status = WriteLevel0Table(mem, edit, nullptr);
      mem->Unref();
      mem = nullptr;
      if (!status.ok()) {
        // Reflect errors immediately so that conditions like full
        // file-systems cause the DB::Open() to fail.
        break;
      }
    }
  }

  delete file;

  // See if we should keep reusing the last log file.
  if (status.ok() && options_.reuse_logs && last_log && compactions == 0) {
    assert(logfile_ == nullptr);
    assert(log_ == nullptr);
    assert(mem_ == nullptr);
    uint64_t lfile_size;
    if (env_->GetFileSize(fname, &lfile_size).ok() &&
        env_->NewAppendableFile(fname, &logfile_).ok()) {
      Log(options_.info_log, "Reusing old log %s \n", fname.c_str());
      log_ = new log::Writer(logfile_, lfile_size);
      logfile_number_ = log_number;
      if (mem != nullptr) {
        mem_ = mem;
        mem = nullptr;
      } else {
        // mem can be nullptr if lognum exists but was empty.
        mem_ = new MemTable(internal_comparator_);
        mem_->Ref();
      }
    }
  }

  if (mem != nullptr) {
    // mem did not get reused; compact it.
    if (status.ok()) {
      *save_manifest = true;
      status = WriteLevel0Table(mem, edit, nullptr);
    }
    mem->Unref();
  }

  return status;
}